

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerGenerator.cc
# Opt level: O0

void __thiscall
InstructionInfo::expand
          (InstructionInfo *this,vector<InstructionInfo,_std::allocator<InstructionInfo>_> *out)

{
  Field *pFVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  reference ppFVar5;
  Field *f_3;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Field_*,_std::allocator<Field_*>_> *__range1_1;
  Field *local_240;
  Field *f_2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Field_*,_std::allocator<Field_*>_> *__range2_1;
  ostringstream nstr;
  Field *f_1;
  iterator __end2;
  iterator __begin2;
  vector<Field_*,_std::allocator<Field_*>_> *__range2;
  string saveName;
  bool carry;
  reference local_58;
  reference local_50;
  Field *f;
  iterator __end1;
  iterator __begin1;
  vector<Field,_std::allocator<Field>_> *__range1;
  vector<Field_*,_std::allocator<Field_*>_> expandedFields;
  vector<InstructionInfo,_std::allocator<InstructionInfo>_> *out_local;
  InstructionInfo *this_local;
  
  expandedFields.super__Vector_base<Field_*,_std::allocator<Field_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)out;
  std::vector<Field_*,_std::allocator<Field_*>_>::vector
            ((vector<Field_*,_std::allocator<Field_*>_> *)&__range1);
  __end1 = std::vector<Field,_std::allocator<Field>_>::begin(&this->fields);
  f = (Field *)std::vector<Field,_std::allocator<Field>_>::end(&this->fields);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Field_*,_std::vector<Field,_std::allocator<Field>_>_>
                                     *)&f), bVar2) {
    local_50 = __gnu_cxx::__normal_iterator<Field_*,_std::vector<Field,_std::allocator<Field>_>_>::
               operator*(&__end1);
    if (((local_50->match & 1U) == 0) && ((local_50->expand & 1U) != 0)) {
      local_50->match = true;
      local_50->value = 0;
      local_58 = local_50;
      std::vector<Field_*,_std::allocator<Field_*>_>::push_back
                ((vector<Field_*,_std::allocator<Field_*>_> *)&__range1,&local_58);
    }
    __gnu_cxx::__normal_iterator<Field_*,_std::vector<Field,_std::allocator<Field>_>_>::operator++
              (&__end1);
  }
  std::__cxx11::string::string((string *)&__range2,(string *)this);
  do {
    saveName.field_2._M_local_buf[0xb] = '\x01';
    __end2 = std::vector<Field_*,_std::allocator<Field_*>_>::begin
                       ((vector<Field_*,_std::allocator<Field_*>_> *)&__range1);
    f_1 = (Field *)std::vector<Field_*,_std::allocator<Field_*>_>::end
                             ((vector<Field_*,_std::allocator<Field_*>_> *)&__range1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_>
                                       *)&f_1), bVar2) {
      ppFVar5 = __gnu_cxx::
                __normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_>::
                operator*(&__end2);
      pFVar1 = *ppFVar5;
      if ((saveName.field_2._M_local_buf[0xb] & 1U) == 0) break;
      pFVar1->value = pFVar1->value + 1 & 1;
      saveName.field_2._M_local_buf[0xb] = pFVar1->value == 0;
      if ((pFVar1->value == 0) || (iVar3 = Field::bitsize(pFVar1), iVar3 == 1)) {
        pFVar1->match = true;
      }
      else {
        pFVar1->match = false;
      }
      __gnu_cxx::__normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_>::
      operator++(&__end2);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range2_1);
    poVar4 = std::operator<<((ostream *)&__range2_1,(string *)&__range2);
    std::ostream::operator<<(poVar4,std::hex);
    __end2_1 = std::vector<Field_*,_std::allocator<Field_*>_>::begin
                         ((vector<Field_*,_std::allocator<Field_*>_> *)&__range1);
    f_2 = (Field *)std::vector<Field_*,_std::allocator<Field_*>_>::end
                             ((vector<Field_*,_std::allocator<Field_*>_> *)&__range1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_>
                               *)&f_2), bVar2) {
      ppFVar5 = __gnu_cxx::
                __normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_>::
                operator*(&__end2_1);
      local_240 = *ppFVar5;
      poVar4 = std::operator<<((ostream *)&__range2_1,"_");
      std::ostream::operator<<(poVar4,local_240->value);
      __gnu_cxx::__normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_>::
      operator++(&__end2_1);
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)this,(string *)&__range1_1);
    std::__cxx11::string::~string((string *)&__range1_1);
    std::vector<InstructionInfo,_std::allocator<InstructionInfo>_>::push_back
              ((vector<InstructionInfo,_std::allocator<InstructionInfo>_> *)
               expandedFields.super__Vector_base<Field_*,_std::allocator<Field_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,this);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range2_1);
    if (((saveName.field_2._M_local_buf[0xb] ^ 0xffU) & 1) == 0) {
      std::__cxx11::string::operator=((string *)this,(string *)&__range2);
      __end1_1 = std::vector<Field_*,_std::allocator<Field_*>_>::begin
                           ((vector<Field_*,_std::allocator<Field_*>_> *)&__range1);
      f_3 = (Field *)std::vector<Field_*,_std::allocator<Field_*>_>::end
                               ((vector<Field_*,_std::allocator<Field_*>_> *)&__range1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_>
                                 *)&f_3), bVar2) {
        ppFVar5 = __gnu_cxx::
                  __normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_>::
                  operator*(&__end1_1);
        pFVar1 = *ppFVar5;
        pFVar1->match = false;
        pFVar1->value = 0;
        __gnu_cxx::__normal_iterator<Field_**,_std::vector<Field_*,_std::allocator<Field_*>_>_>::
        operator++(&__end1_1);
      }
      std::__cxx11::string::~string((string *)&__range2);
      std::vector<Field_*,_std::allocator<Field_*>_>::~vector
                ((vector<Field_*,_std::allocator<Field_*>_> *)&__range1);
      return;
    }
  } while( true );
}

Assistant:

void InstructionInfo::expand(std::vector<InstructionInfo>& out)
{
    std::vector<Field*> expandedFields;
    for(Field& f : fields)
    {
        if(f.match || !f.expand)
            continue;
        f.match = true;
        f.value = 0;
        expandedFields.push_back(&f);
    }
    
    bool carry;
    std::string saveName = name;
    
    do
    {
        carry = true;

        for(Field *f : expandedFields)
        {
            if(!carry)
                break;
            
            //uint32_t mask = ((uint32_t)1U << (uint32_t)f->bitsize()) - 1U;
            f->value = (f->value + 1) & 1; //mask;
            carry = f->value == 0;

            if(f->value == 0 || f->bitsize() == 1)
            {
                f->match = true;
            }
            else
            {
                f->match = false;
            }
        }

        std::ostringstream nstr;
        nstr << saveName << std::hex;
        for(Field *f : expandedFields)
            nstr << "_" << f->value;
        name = nstr.str();
        out.push_back(*this);
    } while(!carry);
    
    name = saveName;
    
    for(Field *f : expandedFields)
    {
        f->match = false;
        f->value = 0;
    }
}